

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O1

void DivisionHelper<int,_int,_5>::DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (int *t,int *u,int *result)

{
  int iVar1;
  int iVar2;
  
  iVar1 = *u;
  if (iVar1 == 0) {
    safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
  }
  iVar2 = *t;
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    if (iVar1 == -1 && iVar2 == -0x80000000) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
    iVar2 = iVar2 / iVar1;
  }
  *result = iVar2;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void DivideThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if(u == 0)
        {
            E::SafeIntOnDivZero();
        }

        if( t == 0 )
        {
            result = 0;
            return;
        }

        // Must test for corner case
        if( t == std::numeric_limits<T>::min() && u == (U)-1 )
            E::SafeIntOnOverflow();

        result = (T)( t/u );
    }